

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChatBox.cpp
# Opt level: O2

void __thiscall gui::ChatBox::draw(ChatBox *this,RenderTarget *target,RenderStates states)

{
  Text *this_00;
  float __x;
  element_type *peVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  Transform *right;
  pointer ppVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  pointer ppVar9;
  long lVar10;
  size_t i;
  ulong uVar11;
  float fVar12;
  float fVar13;
  size_t local_80;
  Vector2f local_60;
  float local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  bVar3 = Widget::isVisible(&this->super_Widget);
  if (!bVar3) {
    return;
  }
  right = Widget::getTransform(&this->super_Widget);
  sf::operator*=(&states.transform,right);
  updateVisibleLines(this,true);
  if (this->autoHide_ == false) {
    sf::RectangleShape::setSize
              (&((this->style_).super___shared_ptr<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->rect_,&this->size_);
    sf::RenderTarget::draw
              (target,(Drawable *)
                      &((this->style_).
                        super___shared_ptr<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       rect_,&states);
  }
  peVar1 = (this->style_).super___shared_ptr<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  fVar12 = (peVar1->textPadding_).z;
  uVar4 = sf::Text::getCharacterSize(&peVar1->text_);
  fVar12 = (float)uVar4 * fVar12;
  peVar1 = (this->style_).super___shared_ptr<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  fVar13 = (float)((this->sizeCharacters_).y - 1) * fVar12 + (peVar1->textPadding_).y;
  __x = (peVar1->textPadding_).x;
  ppVar5 = (this->visibleLines_).
           super__Vector_base<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar9 = (this->visibleLines_).
           super__Vector_base<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = 0;
  local_80 = 0;
  do {
    lVar10 = uVar8 * 0x188;
    do {
      lVar6 = lVar10;
      if (((ulong)(((long)ppVar5 - (long)ppVar9) / 0x188) <= uVar8) ||
         (((this->autoHide_ & 1U) != 0 && (local_80 == this->hideCounter_)))) {
        if ((this->autoHide_ & 1U) != 0) {
          return;
        }
        bVar3 = Widget::isFocused(&this->super_Widget);
        if (!bVar3) {
          return;
        }
        if ((this->selectionStart_).second == true) {
          uVar11 = (this->selectionStart_).first;
          uVar8 = this->selectionEnd_;
          uVar7 = uVar11;
          if (uVar8 < uVar11) {
            uVar7 = uVar8;
            uVar8 = uVar11;
          }
        }
        else {
          uVar7 = 0xffffffffffffffff;
          uVar8 = 0xffffffffffffffff;
        }
        lVar10 = 0x30;
        for (uVar11 = 0;
            ppVar9 = (this->visibleLines_).
                     super__Vector_base<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
            uVar11 < (ulong)(((long)(this->visibleLines_).
                                    super__Vector_base<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar9) /
                            0x188); uVar11 = uVar11 + 1) {
          uVar2 = *(ulong *)((long)&(ppVar9->second).super_Shape.super_Transformable +
                            lVar10 + 0xffffffffffffffc0U);
          if ((uVar7 <= uVar2) && (uVar2 <= uVar8)) {
            sf::Shape::setFillColor
                      ((Shape *)((long)&(ppVar9->second).super_Shape.super_Transformable +
                                lVar10 + 0xffffffffffffffc8U),
                       &((this->style_).
                         super___shared_ptr<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        highlightColor_);
            sf::RenderTarget::draw
                      (target,(Drawable *)
                              ((long)&(((this->visibleLines_).
                                        super__Vector_base<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->second).
                                      super_Shape.super_Transformable + lVar10 + 0xffffffffffffffc8U
                              ),&states);
          }
          lVar10 = lVar10 + 0x188;
        }
        return;
      }
      peVar1 = (this->style_).super___shared_ptr<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_58 = roundf(__x);
      local_48 = fVar13;
      fStack_44 = fVar13;
      fStack_40 = fVar13;
      fStack_3c = fVar13;
      fVar13 = roundf(fVar13);
      local_60.y = fVar13;
      local_60.x = local_58;
      sf::Transformable::setPosition(&(peVar1->text_).super_Transformable,&local_60);
      sf::Text::setString(&((this->style_).
                            super___shared_ptr<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           )->text_,
                          (String *)
                          ((long)&(((this->visibleLines_).
                                    super__Vector_base<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->second).super_Shape.
                                  super_Transformable + lVar6 + 0xffffffffffffffc8U));
      peVar1 = (this->style_).super___shared_ptr<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      this_00 = &peVar1->text_;
      if (this->autoHide_ == false) {
        sf::Text::setFillColor
                  (this_00,(Color *)((long)&(((this->visibleLines_).
                                              super__Vector_base<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->second).
                                            super_Shape.super_Transformable +
                                    lVar6 + 0xffffffffffffffe8U));
      }
      else {
        sf::Text::setFillColor(this_00,&peVar1->invertedTextColor_);
        ppVar9 = (this->visibleLines_).
                 super__Vector_base<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        sf::Shape::setFillColor
                  ((Shape *)((long)&(ppVar9->second).super_Shape.super_Transformable +
                            lVar6 + 0xfffffffffffffff8U),
                   (Color *)((long)&(ppVar9->second).super_Shape.super_Transformable +
                            lVar6 + 0xffffffffffffffe8U));
        sf::RenderTarget::draw
                  (target,(Drawable *)
                          ((long)&(((this->visibleLines_).
                                    super__Vector_base<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->second).super_Shape.
                                  super_Transformable + lVar6 + 0xfffffffffffffff8U),&states);
      }
      sf::Text::setStyle(&((this->style_).
                           super___shared_ptr<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                          ->text_,*(Uint32 *)
                                   ((long)&(((this->visibleLines_).
                                             super__Vector_base<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->second).
                                           super_Shape.super_Transformable +
                                   lVar6 + 0xffffffffffffffecU));
      sf::RenderTarget::draw
                (target,&(((this->style_).
                           super___shared_ptr<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                         ->text_).super_Drawable,&states);
      fVar13 = local_48 - fVar12;
      uVar8 = uVar8 + 1;
      ppVar9 = (this->visibleLines_).
               super__Vector_base<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar5 = (this->visibleLines_).
               super__Vector_base<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar10 = lVar6 + 0x188;
    } while ((ulong)(((long)ppVar5 - (long)ppVar9) / 0x188) <= uVar8);
    local_80 = local_80 +
               (*(long *)((long)&(ppVar9->second).super_Shape.super_Transformable +
                         lVar6 + 0xfffffffffffffff0U) !=
               *(long *)((long)&ppVar9[1].second.super_Shape.super_Transformable +
                        lVar6 + 0xfffffffffffffff0U));
  } while( true );
}

Assistant:

void ChatBox::draw(sf::RenderTarget& target, sf::RenderStates states) const {
    if (!isVisible()) {
        return;
    }
    states.transform *= getTransform();

    updateVisibleLines(true);

    if (!autoHide_) {
        style_->rect_.setSize(size_);
        target.draw(style_->rect_, states);
    }

    const float textHeight = style_->textPadding_.z * style_->getCharacterSize();
    sf::Vector2f lastPosition = {
        style_->textPadding_.x,
        style_->textPadding_.y + textHeight * (sizeCharacters_.y - 1)
    };
    size_t lineCount = 0;
    for (size_t i = 0; i < visibleLines_.size(); ++i) {
        if (autoHide_ && lineCount == hideCounter_) {
            break;
        }
        style_->text_.setPosition(roundVector2f(lastPosition));
        style_->text_.setString(visibleLines_[i].first.str);
        if (!autoHide_) {
            style_->text_.setFillColor(visibleLines_[i].first.color);
        } else {
            style_->text_.setFillColor(style_->invertedTextColor_);
            visibleLines_[i].second.setFillColor(visibleLines_[i].first.color);
            target.draw(visibleLines_[i].second, states);
        }
        style_->text_.setStyle(visibleLines_[i].first.style);
        target.draw(style_->text_, states);
        lastPosition.y -= textHeight;
        if (i + 1 < visibleLines_.size() && visibleLines_[i].first.id != visibleLines_[i + 1].first.id) {
            ++lineCount;
        }
    }

    if (!autoHide_ && isFocused()) {
        size_t selectionMin = std::numeric_limits<size_t>::max();
        size_t selectionMax = std::numeric_limits<size_t>::max();
        if (selectionStart_.second) {
            selectionMin = std::min(selectionStart_.first, selectionEnd_);
            selectionMax = std::max(selectionStart_.first, selectionEnd_);
        }

        for (size_t i = 0; i < visibleLines_.size(); ++i) {
            if (visibleLines_[i].first.id >= selectionMin && visibleLines_[i].first.id <= selectionMax) {
                visibleLines_[i].second.setFillColor(style_->highlightColor_);
                target.draw(visibleLines_[i].second, states);
            }
        }
    }
}